

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

void __thiscall cmFileLockPool::~cmFileLockPool(cmFileLockPool *this)

{
  cmFileLockPool *this_local;
  
  cmDeleteAll<std::__cxx11::list<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FunctionScopes);
  cmDeleteAll<std::__cxx11::list<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FileScopes);
  ScopePool::~ScopePool(&this->ProcessScope);
  std::__cxx11::list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
  ~list(&this->FileScopes);
  std::__cxx11::list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
  ~list(&this->FunctionScopes);
  return;
}

Assistant:

cmFileLockPool::~cmFileLockPool()
{
  cmDeleteAll(this->FunctionScopes);
  cmDeleteAll(this->FileScopes);
}